

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

string * google::protobuf::internal::SubMessagePrefix
                   (string *prefix,FieldDescriptor *field,int index)

{
  bool bVar1;
  int in_ECX;
  FieldDescriptor *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *result;
  int in_stack_ffffffffffffff5c;
  AlphaNum *in_stack_ffffffffffffff60;
  AlphaNum *in_stack_ffffffffffffff98;
  string local_50 [51];
  undefined1 local_1d;
  int local_1c;
  FieldDescriptor *local_18;
  
  local_1d = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  bVar1 = FieldDescriptor::is_extension(local_18);
  if (bVar1) {
    std::__cxx11::string::append((char *)in_RDI);
    in_stack_ffffffffffffff60 = (AlphaNum *)FieldDescriptor::full_name_abi_cxx11_(local_18);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::append((char *)in_RDI);
  }
  else {
    FieldDescriptor::name_abi_cxx11_(local_18);
    std::__cxx11::string::append((string *)in_RDI);
  }
  if (local_1c != -1) {
    std::__cxx11::string::append((char *)in_RDI);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff98);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::append((char *)in_RDI);
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(StrCat(index));
    result.append("]");
  }
  result.append(".");
  return result;
}